

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage_config.cc
# Opt level: O2

FlagsUsageConfig * absl::flags_internal::GetUsageConfig(void)

{
  FlagsUsageConfig *in_RDI;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string_view<char,_std::char_traits<char>_>
  *local_20;
  
  Mutex::Lock((Mutex *)&(anonymous_namespace)::custom_usage_config_guard);
  if ((anonymous_namespace)::custom_usage_config == (FlagsUsageConfig *)0x0) {
    memset(in_RDI,0,0xa0);
    local_20 = anon_unknown_0::ContainsHelpshortFlags;
    std::function<bool(std::basic_string_view<char,std::char_traits<char>>)>::operator=
              ((function<bool(std::basic_string_view<char,std::char_traits<char>>)> *)in_RDI,
               (_func_bool_basic_string_view<char,_std::char_traits<char>_> **)&local_20);
    local_20 = anon_unknown_0::ContainsHelppackageFlags;
    std::function<bool(std::basic_string_view<char,std::char_traits<char>>)>::operator=
              ((function<bool(std::basic_string_view<char,std::char_traits<char>>)> *)
               &in_RDI->contains_help_flags,
               (_func_bool_basic_string_view<char,_std::char_traits<char>_> **)&local_20);
    local_20 = anon_unknown_0::ContainsHelppackageFlags;
    std::function<bool(std::basic_string_view<char,std::char_traits<char>>)>::operator=
              ((function<bool(std::basic_string_view<char,std::char_traits<char>>)> *)
               &in_RDI->contains_helppackage_flags,
               (_func_bool_basic_string_view<char,_std::char_traits<char>_> **)&local_20);
    local_20 = (anonymous_namespace)::VersionString_abi_cxx11_;
    std::function<std::__cxx11::string()>::operator=
              ((function<std::__cxx11::string()> *)&in_RDI->version_string,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_20
              );
    local_20 = (anonymous_namespace)::NormalizeFilename_abi_cxx11_;
    std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>::
    operator=((function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)> *
              )&in_RDI->normalize_filename,&local_20);
  }
  else {
    FlagsUsageConfig::FlagsUsageConfig(in_RDI,(anonymous_namespace)::custom_usage_config);
  }
  Mutex::Unlock((Mutex *)&(anonymous_namespace)::custom_usage_config_guard);
  return in_RDI;
}

Assistant:

FlagsUsageConfig GetUsageConfig() {
  absl::MutexLock l(&custom_usage_config_guard);

  if (custom_usage_config) return *custom_usage_config;

  FlagsUsageConfig default_config;
  default_config.contains_helpshort_flags = &ContainsHelpshortFlags;
  default_config.contains_help_flags = &ContainsHelppackageFlags;
  default_config.contains_helppackage_flags = &ContainsHelppackageFlags;
  default_config.version_string = &VersionString;
  default_config.normalize_filename = &NormalizeFilename;

  return default_config;
}